

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O1

int __thiscall zmq::tcp_connecter_t::open(tcp_connecter_t *this,char *__file,int __oflag,...)

{
  uint __fd;
  void *pvVar1;
  address_t *paVar2;
  bool bVar3;
  fd_t fVar4;
  int iVar5;
  socklen_t sVar6;
  undefined8 in_RAX;
  tcp_address_t *this_00;
  sockaddr *psVar7;
  int *piVar8;
  int __oflag_00;
  options_t *options_;
  tcp_address_t *ptVar9;
  char *__file_00;
  int flag;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((this->super_stream_connecter_base_t)._s != -1) {
    open((char *)this,(int)__file,___oflag);
  }
  pvVar1 = (((this->super_stream_connecter_base_t)._addr)->resolved).dummy;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,0x3c);
    (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = (void *)0x0;
  }
  iVar5 = 0x1ef0c8;
  ptVar9 = (tcp_address_t *)0x3c;
  this_00 = (tcp_address_t *)operator_new(0x3c,(nothrow_t *)&std::nothrow);
  if (this_00 == (tcp_address_t *)0x0) {
    this_00 = (tcp_address_t *)0x0;
  }
  else {
    ptVar9 = this_00;
    tcp_address_t::tcp_address_t(this_00);
  }
  (((this->super_stream_connecter_base_t)._addr)->resolved).tcp_addr = this_00;
  if ((((this->super_stream_connecter_base_t)._addr)->resolved).dummy == (void *)0x0) {
    open((char *)ptVar9,iVar5);
  }
  paVar2 = (this->super_stream_connecter_base_t)._addr;
  options_ = &(this->super_stream_connecter_base_t).super_own_t.options;
  fVar4 = tcp_open_socket((paVar2->address)._M_dataplus._M_p,options_,false,true,
                          (paVar2->resolved).tcp_addr);
  (this->super_stream_connecter_base_t)._s = fVar4;
  pvVar1 = (((this->super_stream_connecter_base_t)._addr)->resolved).dummy;
  if (fVar4 == -1) {
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,0x3c);
    }
    (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = (void *)0x0;
LAB_0019deac:
    iVar5 = -1;
  }
  else {
    if (pvVar1 == (void *)0x0) {
      open((char *)0x0,(int)options_);
    }
    unblock_socket((this->super_stream_connecter_base_t)._s);
    ptVar9 = (((this->super_stream_connecter_base_t)._addr)->resolved).tcp_addr;
    bVar3 = tcp_address_t::has_src_addr(ptVar9);
    if (bVar3) {
      uStack_28 = CONCAT44(1,(undefined4)uStack_28);
      __fd = (this->super_stream_connecter_base_t)._s;
      __file_00 = (char *)(ulong)__fd;
      __oflag_00 = 1;
      iVar5 = setsockopt(__fd,1,2,(void *)((long)&uStack_28 + 4),4);
      if (iVar5 != 0) {
        open(__file_00,__oflag_00);
      }
      iVar5 = (this->super_stream_connecter_base_t)._s;
      psVar7 = tcp_address_t::src_addr(ptVar9);
      sVar6 = tcp_address_t::src_addrlen(ptVar9);
      iVar5 = bind(iVar5,(sockaddr *)psVar7,sVar6);
      if (iVar5 == -1) goto LAB_0019deac;
    }
    iVar5 = (this->super_stream_connecter_base_t)._s;
    psVar7 = tcp_address_t::addr(ptVar9);
    sVar6 = tcp_address_t::addrlen(ptVar9);
    iVar5 = ::connect(iVar5,(sockaddr *)psVar7,sVar6);
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      piVar8 = __errno_location();
      iVar5 = -1;
      if (*piVar8 == 4) {
        *piVar8 = 0x73;
      }
    }
  }
  return iVar5;
}

Assistant:

int zmq::tcp_connecter_t::open ()
{
    zmq_assert (_s == retired_fd);

    //  Resolve the address
    if (_addr->resolved.tcp_addr != NULL) {
        LIBZMQ_DELETE (_addr->resolved.tcp_addr);
    }

    _addr->resolved.tcp_addr = new (std::nothrow) tcp_address_t ();
    alloc_assert (_addr->resolved.tcp_addr);
    _s = tcp_open_socket (_addr->address.c_str (), options, false, true,
                          _addr->resolved.tcp_addr);
    if (_s == retired_fd) {
        //  TODO we should emit some event in this case!

        LIBZMQ_DELETE (_addr->resolved.tcp_addr);
        return -1;
    }
    zmq_assert (_addr->resolved.tcp_addr != NULL);

    // Set the socket to non-blocking mode so that we get async connect().
    unblock_socket (_s);

    const tcp_address_t *const tcp_addr = _addr->resolved.tcp_addr;

    int rc;

    // Set a source address for conversations
    if (tcp_addr->has_src_addr ()) {
        //  Allow reusing of the address, to connect to different servers
        //  using the same source port on the client.
        int flag = 1;
#ifdef ZMQ_HAVE_WINDOWS
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR,
                         reinterpret_cast<const char *> (&flag), sizeof (int));
        wsa_assert (rc != SOCKET_ERROR);
#elif defined ZMQ_HAVE_VXWORKS
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR, (char *) &flag,
                         sizeof (int));
        errno_assert (rc == 0);
#else
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR, &flag, sizeof (int));
        errno_assert (rc == 0);
#endif

#if defined ZMQ_HAVE_VXWORKS
        rc = ::bind (_s, (sockaddr *) tcp_addr->src_addr (),
                     tcp_addr->src_addrlen ());
#else
        rc = ::bind (_s, tcp_addr->src_addr (), tcp_addr->src_addrlen ());
#endif
        if (rc == -1)
            return -1;
    }

    //  Connect to the remote peer.
#if defined ZMQ_HAVE_VXWORKS
    rc = ::connect (_s, (sockaddr *) tcp_addr->addr (), tcp_addr->addrlen ());
#else
    rc = ::connect (_s, tcp_addr->addr (), tcp_addr->addrlen ());
#endif
    //  Connect was successful immediately.
    if (rc == 0) {
        return 0;
    }

    //  Translate error codes indicating asynchronous connect has been
    //  launched to a uniform EINPROGRESS.
#ifdef ZMQ_HAVE_WINDOWS
    const int last_error = WSAGetLastError ();
    if (last_error == WSAEINPROGRESS || last_error == WSAEWOULDBLOCK)
        errno = EINPROGRESS;
    else
        errno = wsa_error_to_errno (last_error);
#else
    if (errno == EINTR)
        errno = EINPROGRESS;
#endif
    return -1;
}